

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder.c
# Opt level: O3

_Bool lz_encoder_prepare(lzma_mf *mf,lzma_allocator *allocator,lzma_lz_options_conflict *lz_options)

{
  size_t sVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint32_t uVar5;
  ulong uVar6;
  _Bool _Var7;
  lzma_match_finder lVar8;
  uint32_t uVar9;
  code *pcVar10;
  uint32_t uVar11;
  code *pcVar12;
  uint32_t uVar13;
  long lVar14;
  lzma_match_finder lVar15;
  
  uVar3 = lz_options->dict_size;
  _Var7 = true;
  if (0xffffffffa0000ffe < uVar3 - 0x60000001) {
    uVar6 = lz_options->match_len_max;
    uVar4 = lz_options->nice_len;
    if (uVar4 <= uVar6) {
      sVar1 = lz_options->before_size;
      uVar11 = (int)sVar1 + (int)uVar3;
      mf->keep_size_before = uVar11;
      lVar14 = lz_options->after_size + uVar6;
      uVar13 = (uint32_t)lVar14;
      mf->keep_size_after = uVar13;
      uVar5 = mf->size;
      uVar11 = uVar13 + (int)(uVar3 >> 1) + uVar11 + (int)(lVar14 + sVar1 >> 1) + 0x80000;
      mf->size = uVar11;
      if ((mf->buffer != (uint8_t *)0x0) && (uVar5 != uVar11)) {
        lzma_free(mf->buffer,allocator);
        mf->buffer = (uint8_t *)0x0;
        uVar3 = lz_options->dict_size;
        uVar6 = lz_options->match_len_max;
        uVar4 = lz_options->nice_len;
      }
      mf->match_len_max = (uint32_t)uVar6;
      mf->nice_len = (lzma_match_finder)uVar4;
      uVar5 = (int)uVar3 + 1;
      mf->cyclic_size = uVar5;
      lVar15 = lz_options->match_finder;
      if ((int)lVar15 < 0x12) {
        if (lVar15 == LZMA_MF_HC3) {
          pcVar10 = lzma_mf_hc3_skip;
          pcVar12 = lzma_mf_hc3_find;
        }
        else {
          if (lVar15 != LZMA_MF_HC4) {
            return true;
          }
          pcVar10 = lzma_mf_hc4_skip;
          pcVar12 = lzma_mf_hc4_find;
        }
      }
      else if (lVar15 == LZMA_MF_BT2) {
        pcVar10 = lzma_mf_bt2_skip;
        pcVar12 = lzma_mf_bt2_find;
      }
      else if (lVar15 == LZMA_MF_BT3) {
        pcVar10 = lzma_mf_bt3_skip;
        pcVar12 = lzma_mf_bt3_find;
      }
      else {
        if (lVar15 != LZMA_MF_BT4) {
          return true;
        }
        pcVar10 = lzma_mf_bt4_skip;
        pcVar12 = lzma_mf_bt4_find;
      }
      mf->find = pcVar12;
      mf->skip = pcVar10;
      lVar8 = lVar15 & 0xf;
      if (lVar8 <= (lzma_match_finder)uVar4) {
        lVar15 = lVar15 & 0x10;
        uVar2 = 0xffff;
        if (((lVar8 != 2) &&
            (uVar2 = (int)uVar3 - 1, uVar2 = uVar2 >> 1 | uVar2, uVar2 = uVar2 >> 2 | uVar2,
            uVar2 = uVar2 >> 4 | uVar2, uVar2 = uVar2 >> 1 | uVar2 >> 9 | 0xffff, 0x1000000 < uVar2)
            ) && (uVar2 = uVar2 >> 1, lVar8 == LZMA_MF_HC3)) {
          uVar2 = 0xffffff;
        }
        mf->hash_mask = uVar2;
        uVar9 = (uint)(LZMA_MF_HC3 < lVar8) * 0x10000 + (uint)(2 < lVar8) * 0x400 + uVar2 + 1;
        uVar11 = mf->hash_count;
        uVar5 = uVar5 << (sbyte)(lVar15 >> 4);
        uVar13 = mf->sons_count;
        mf->hash_count = uVar9;
        mf->sons_count = uVar5;
        if ((uVar11 != uVar9) || (uVar13 != uVar5)) {
          lzma_free(mf->hash,allocator);
          mf->hash = (uint32_t *)0x0;
          lzma_free(mf->son,allocator);
          mf->son = (uint32_t *)0x0;
        }
        uVar5 = lz_options->depth;
        mf->depth = uVar5;
        if (uVar5 == 0) {
          uVar2 = mf->nice_len >> (lVar15 == 0) + 1;
          uVar5 = uVar2 + 0x10;
          if (lVar15 == 0) {
            uVar5 = uVar2 + 4;
          }
          mf->depth = uVar5;
        }
        _Var7 = false;
      }
    }
  }
  return _Var7;
}

Assistant:

static bool
lz_encoder_prepare(lzma_mf *mf, const lzma_allocator *allocator,
		const lzma_lz_options *lz_options)
{
	// For now, the dictionary size is limited to 1.5 GiB. This may grow
	// in the future if needed, but it needs a little more work than just
	// changing this check.
	if (lz_options->dict_size < LZMA_DICT_SIZE_MIN
			|| lz_options->dict_size
				> (UINT32_C(1) << 30) + (UINT32_C(1) << 29)
			|| lz_options->nice_len > lz_options->match_len_max)
		return true;

	mf->keep_size_before = lz_options->before_size + lz_options->dict_size;

	mf->keep_size_after = lz_options->after_size
			+ lz_options->match_len_max;

	// To avoid constant memmove()s, allocate some extra space. Since
	// memmove()s become more expensive when the size of the buffer
	// increases, we reserve more space when a large dictionary is
	// used to make the memmove() calls rarer.
	//
	// This works with dictionaries up to about 3 GiB. If bigger
	// dictionary is wanted, some extra work is needed:
	//   - Several variables in lzma_mf have to be changed from uint32_t
	//     to size_t.
	//   - Memory usage calculation needs something too, e.g. use uint64_t
	//     for mf->size.
	uint32_t reserve = lz_options->dict_size / 2;
	if (reserve > (UINT32_C(1) << 30))
		reserve /= 2;

	reserve += (lz_options->before_size + lz_options->match_len_max
			+ lz_options->after_size) / 2 + (UINT32_C(1) << 19);

	const uint32_t old_size = mf->size;
	mf->size = mf->keep_size_before + reserve + mf->keep_size_after;

	// Deallocate the old history buffer if it exists but has different
	// size than what is needed now.
	if (mf->buffer != NULL && old_size != mf->size) {
		lzma_free(mf->buffer, allocator);
		mf->buffer = NULL;
	}

	// Match finder options
	mf->match_len_max = lz_options->match_len_max;
	mf->nice_len = lz_options->nice_len;

	// cyclic_size has to stay smaller than 2 Gi. Note that this doesn't
	// mean limiting dictionary size to less than 2 GiB. With a match
	// finder that uses multibyte resolution (hashes start at e.g. every
	// fourth byte), cyclic_size would stay below 2 Gi even when
	// dictionary size is greater than 2 GiB.
	//
	// It would be possible to allow cyclic_size >= 2 Gi, but then we
	// would need to be careful to use 64-bit types in various places
	// (size_t could do since we would need bigger than 32-bit address
	// space anyway). It would also require either zeroing a multigigabyte
	// buffer at initialization (waste of time and RAM) or allow
	// normalization in lz_encoder_mf.c to access uninitialized
	// memory to keep the code simpler. The current way is simple and
	// still allows pretty big dictionaries, so I don't expect these
	// limits to change.
	mf->cyclic_size = lz_options->dict_size + 1;

	// Validate the match finder ID and setup the function pointers.
	switch (lz_options->match_finder) {
#ifdef HAVE_MF_HC3
	case LZMA_MF_HC3:
		mf->find = &lzma_mf_hc3_find;
		mf->skip = &lzma_mf_hc3_skip;
		break;
#endif
#ifdef HAVE_MF_HC4
	case LZMA_MF_HC4:
		mf->find = &lzma_mf_hc4_find;
		mf->skip = &lzma_mf_hc4_skip;
		break;
#endif
#ifdef HAVE_MF_BT2
	case LZMA_MF_BT2:
		mf->find = &lzma_mf_bt2_find;
		mf->skip = &lzma_mf_bt2_skip;
		break;
#endif
#ifdef HAVE_MF_BT3
	case LZMA_MF_BT3:
		mf->find = &lzma_mf_bt3_find;
		mf->skip = &lzma_mf_bt3_skip;
		break;
#endif
#ifdef HAVE_MF_BT4
	case LZMA_MF_BT4:
		mf->find = &lzma_mf_bt4_find;
		mf->skip = &lzma_mf_bt4_skip;
		break;
#endif

	default:
		return true;
	}

	// Calculate the sizes of mf->hash and mf->son and check that
	// nice_len is big enough for the selected match finder.
	const uint32_t hash_bytes = lz_options->match_finder & 0x0F;
	if (hash_bytes > mf->nice_len)
		return true;

	const bool is_bt = (lz_options->match_finder & 0x10) != 0;
	uint32_t hs;

	if (hash_bytes == 2) {
		hs = 0xFFFF;
	} else {
		// Round dictionary size up to the next 2^n - 1 so it can
		// be used as a hash mask.
		hs = lz_options->dict_size - 1;
		hs |= hs >> 1;
		hs |= hs >> 2;
		hs |= hs >> 4;
		hs |= hs >> 8;
		hs >>= 1;
		hs |= 0xFFFF;

		if (hs > (UINT32_C(1) << 24)) {
			if (hash_bytes == 3)
				hs = (UINT32_C(1) << 24) - 1;
			else
				hs >>= 1;
		}
	}

	mf->hash_mask = hs;

	++hs;
	if (hash_bytes > 2)
		hs += HASH_2_SIZE;
	if (hash_bytes > 3)
		hs += HASH_3_SIZE;
/*
	No match finder uses this at the moment.
	if (mf->hash_bytes > 4)
		hs += HASH_4_SIZE;
*/

	const uint32_t old_hash_count = mf->hash_count;
	const uint32_t old_sons_count = mf->sons_count;
	mf->hash_count = hs;
	mf->sons_count = mf->cyclic_size;
	if (is_bt)
		mf->sons_count *= 2;

	// Deallocate the old hash array if it exists and has different size
	// than what is needed now.
	if (old_hash_count != mf->hash_count
			|| old_sons_count != mf->sons_count) {
		lzma_free(mf->hash, allocator);
		mf->hash = NULL;

		lzma_free(mf->son, allocator);
		mf->son = NULL;
	}

	// Maximum number of match finder cycles
	mf->depth = lz_options->depth;
	if (mf->depth == 0) {
		if (is_bt)
			mf->depth = 16 + mf->nice_len / 2;
		else
			mf->depth = 4 + mf->nice_len / 4;
	}

	return false;
}